

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<CPP::WriteInitialization::Buddy>::moveAppend
          (QGenericArrayOps<CPP::WriteInitialization::Buddy> *this,Buddy *b,Buddy *e)

{
  qsizetype *pqVar1;
  Buddy *pBVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size;
      pDVar4 = (b->labelVarName).d.d;
      (b->labelVarName).d.d = (Data *)0x0;
      pBVar2[lVar3].labelVarName.d.d = pDVar4;
      pcVar5 = (b->labelVarName).d.ptr;
      (b->labelVarName).d.ptr = (char16_t *)0x0;
      pBVar2[lVar3].labelVarName.d.ptr = pcVar5;
      qVar6 = (b->labelVarName).d.size;
      (b->labelVarName).d.size = 0;
      pBVar2[lVar3].labelVarName.d.size = qVar6;
      pDVar4 = (b->buddyAttributeName).d.d;
      (b->buddyAttributeName).d.d = (Data *)0x0;
      pBVar2[lVar3].buddyAttributeName.d.d = pDVar4;
      pcVar5 = (b->buddyAttributeName).d.ptr;
      (b->buddyAttributeName).d.ptr = (char16_t *)0x0;
      pBVar2[lVar3].buddyAttributeName.d.ptr = pcVar5;
      qVar6 = (b->buddyAttributeName).d.size;
      (b->buddyAttributeName).d.size = 0;
      pBVar2[lVar3].buddyAttributeName.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }